

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

FString __thiscall level_info_t::LookupLevelName(level_info_t *this)

{
  FString *other;
  uint uVar1;
  char *__haystack;
  char *pcVar2;
  size_t sVar3;
  long in_RSI;
  char checkstring [32];
  char local_48 [40];
  
  other = (FString *)(in_RSI + 0x78);
  if ((*(byte *)(in_RSI + 0x67) & 4) == 0) {
    FString::AttachToOther((FString *)this,other);
    return (FString)(char *)this;
  }
  __haystack = FStringTable::operator[](&GStrings,other->Chars);
  if (__haystack == (char *)0x0) {
    __haystack = other->Chars;
    goto LAB_004b44ca;
  }
  pcVar2 = *(char **)(in_RSI + 8);
  uVar1 = *(uint *)(pcVar2 + -0xc);
  if (uVar1 < 4) {
LAB_004b445d:
    if (((((uVar1 < 6) || (*pcVar2 != 'L')) || (pcVar2[1] != 'E')) ||
        ((pcVar2[2] != 'V' || (pcVar2[3] != 'E')))) || (pcVar2[4] != 'L')) {
      local_48[0] = '\0';
    }
    else {
      pcVar2 = pcVar2 + 5;
LAB_004b4483:
      uVar1 = atoi(pcVar2);
      mysnprintf(local_48,0x20,"%d: ",(ulong)uVar1);
    }
  }
  else {
    if ((*pcVar2 != 'E') || (pcVar2[2] != 'M')) {
      if ((uVar1 < 4) || (((*pcVar2 != 'M' || (pcVar2[1] != 'A')) || (pcVar2[2] != 'P'))))
      goto LAB_004b445d;
      pcVar2 = pcVar2 + 3;
      goto LAB_004b4483;
    }
    mysnprintf(local_48,0x20,"%s: ");
  }
  pcVar2 = strstr(__haystack,local_48);
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(local_48);
    __haystack = pcVar2 + sVar3;
  }
LAB_004b44ca:
  FString::FString((FString *)this,__haystack);
  return (FString)(char *)this;
}

Assistant:

FString level_info_t::LookupLevelName()
{
	if (flags & LEVEL_LOOKUPLEVELNAME)
	{
		const char *thename;
		const char *lookedup;

		lookedup = GStrings[LevelName];
		if (lookedup == NULL)
		{
			thename = LevelName;
		}
		else
		{
			char checkstring[32];

			// Strip out the header from the localized string
			if (MapName.Len() > 3 && MapName[0] == 'E' && MapName[2] == 'M')
			{
				mysnprintf (checkstring, countof(checkstring), "%s: ", MapName.GetChars());
			}
			else if (MapName.Len() > 3 && MapName[0] == 'M' && MapName[1] == 'A' && MapName[2] == 'P')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[3]));
			}
			else if (MapName.Len() > 5 && MapName[0] == 'L' && MapName[1] == 'E' && MapName[2] == 'V' && MapName[3] == 'E' && MapName[4] == 'L')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[5]));
			}
			else
			{
				// make sure nothing is stripped.
				checkstring[0] = '\0';
			}
			thename = strstr (lookedup, checkstring);
			if (thename == NULL)
			{
				thename = lookedup;
			}
			else
			{
				thename += strlen (checkstring);
			}
		}
		return thename;
	}
	else return LevelName;
}